

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::
utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::utlru_cache(utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
              *this,milliseconds ttl,size_t capacity,float max_load_factor)

{
  __hashtable *__this;
  allocator_type local_36;
  allocator_type local_35;
  float local_34;
  
  *(undefined8 *)((long)&(this->m_lock).m_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_lock).m_lock.super___mutex_base._M_mutex + 8) = 0;
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_ttl).__r = ttl.__r;
  this->m_used_size = 0;
  local_34 = max_load_factor;
  std::
  vector<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::vector(&this->m_elements,capacity,&local_35);
  (this->m_keyed_elements)._M_h._M_buckets = &(this->m_keyed_elements)._M_h._M_single_bucket;
  (this->m_keyed_elements)._M_h._M_bucket_count = 1;
  (this->m_keyed_elements)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_keyed_elements)._M_h._M_element_count = 0;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_keyed_elements)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            (&this->m_lru_list,capacity,&local_36);
  (this->m_ttl_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->m_ttl_list;
  (this->m_ttl_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->m_ttl_list;
  (this->m_ttl_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node
  ._M_size = 0;
  (this->m_lru_end)._M_node = (_List_node_base *)0x0;
  std::iota<std::_List_iterator<unsigned_long>,int>
            ((this->m_lru_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl._M_node.super__List_node_base._M_next,
             (_List_iterator<unsigned_long>)&this->m_lru_list,0);
  (this->m_lru_end)._M_node =
       (this->m_lru_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_max_load_factor = local_34;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_next_resize = 0;
  std::__detail::
  _Rehash_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
             *)&this->m_keyed_elements,capacity);
  return;
}

Assistant:

utlru_cache(std::chrono::milliseconds ttl, size_t capacity, float max_load_factor = 1.0f)
        : m_ttl(ttl),
          m_elements(capacity),
          m_lru_list(capacity)
    {
        std::iota(m_lru_list.begin(), m_lru_list.end(), 0);
        m_lru_end = m_lru_list.begin();

        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }